

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O3

MemChunk * __thiscall
cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::arenaAlloc
          (MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *this,size_type chunkSize
          )

{
  SmallMemChunk *chunk;
  MemSegment *pMVar1;
  SmallMemChunk *curr;
  ulong uVar2;
  MemSegment *pMVar3;
  SmallMemChunk *pSVar4;
  uint uVar5;
  ulong uVar6;
  SmallMemChunk *pSVar7;
  CircularList<cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
  *pCVar8;
  size_type *psVar9;
  
  uVar2 = chunkSize + 0x18;
  if ((chunkSize < 0xffffffffffffffe8) &&
     ((this->m_footprintLimit == 0 ||
      (uVar6 = this->m_footprint + uVar2,
      uVar6 <= this->m_footprintLimit && this->m_footprint < uVar6)))) {
    uVar6 = this->m_arena->m_minSize;
    if (uVar6 < uVar2) {
      uVar6 = uVar2;
    }
    pMVar3 = (MemSegment *)malloc(uVar6);
    if (pMVar3 != (MemSegment *)0x0) {
      uVar2 = this->m_footprint + uVar6;
      this->m_footprint = uVar2;
      if (this->m_maxFootprint < uVar2) {
        this->m_maxFootprint = uVar2;
      }
      pMVar3->m_size = uVar6;
      pMVar3->m_pad = 1;
      uVar2 = uVar6 - 0x18;
      pMVar3[1].m_size = uVar2;
      *(ulong *)((long)pMVar3 + (uVar6 - 8)) = uVar2;
      pMVar1 = this->m_segList;
      if (pMVar1 == (MemSegment *)0x0) {
        this->m_release_checks = 0xfff;
      }
      psVar9 = &pMVar3->m_pad;
      this->m_segList = pMVar3;
      pMVar3->m_next = pMVar1;
      uVar6 = (uVar2 & 0xfffffffffffffff0) - chunkSize;
      if (uVar6 < 0x20) {
        return (MemChunk *)psVar9;
      }
      chunk = (SmallMemChunk *)((long)psVar9 + chunkSize);
      pMVar3[1].m_size = chunkSize;
      *(size_type *)((long)&pMVar3->m_pad + chunkSize) = chunkSize;
      *(ulong *)((long)&pMVar3[1].m_size + chunkSize) = uVar6;
      *(ulong *)((long)&pMVar3->m_pad + (uVar2 & 0xfffffffffffffff0)) = uVar6;
      if (0xff < uVar6) {
        addLargeChunk(this,(MemChunk *)chunk);
        return (MemChunk *)psVar9;
      }
      uVar5 = (uint)(uVar6 >> 3) & 0x1e;
      pSVar4 = this->m_smallLists[uVar5].m_head;
      if (pSVar4 == (SmallMemChunk *)0x0) {
        pCVar8 = this->m_smallLists + uVar5;
        pSVar4 = chunk;
        pSVar7 = chunk;
      }
      else {
        pSVar7 = pSVar4->next;
        pSVar4->next = chunk;
        pCVar8 = (CircularList<cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
                  *)&pSVar7->prev;
      }
      pCVar8->m_head = chunk;
      chunk->next = pSVar7;
      chunk->prev = pSVar4;
      if ((this->m_smallMap >> uVar5 & 1) != 0) {
        return (MemChunk *)psVar9;
      }
      this->m_smallMap = this->m_smallMap | 1 << (sbyte)uVar5;
      return (MemChunk *)psVar9;
    }
  }
  return (MemChunk *)0x0;
}

Assistant:

MemChunk*
    arenaAlloc (size_type chunkSize)
    {
        size_type estSize;             /* allocation size */

        estSize = chunkSize + SEGMENT_OVERHEAD;
        if (estSize <= chunkSize)
        {
            // Technically can never reach here due to the MAX_REQUEST value
            //
            // However it is always good to have a check.
            return nullptr;
        }

        /*
         * Check user specified foot print limit
         */
        if (m_footprintLimit != 0)
        {
            size_type fp = m_footprint + estSize;
            if (fp <= m_footprint || fp > m_footprintLimit)
            {
                return nullptr;
            }
        }

        /*
         * Request memory segments from arena.
         */
        size_type segSize = estSize;
        MemSegment* seg = (MemSegment*)m_arena.getSegment (segSize);
        m_logger.logGetSegment (seg, segSize);

        /*
         * Initialize the segment obtained.
         */
        if (seg)
        {

            if ((m_footprint += segSize) > m_maxFootprint)
            {
                m_maxFootprint = m_footprint;
            }

            MemChunk* chunk = seg->init (segSize);

            if (m_segList == nullptr)
            {
                m_segList = seg;
                seg->setNext (nullptr);

                m_release_checks = MAX_RELEASE_CHECK_RATE;
            }
            else
            {
                seg->setNext (m_segList);
                m_segList = seg;
            }

            return splitChunk (chunk, chunkSize);
        }
        return nullptr;
    }